

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall application::Chat::calcPrompt(Chat *this)

{
  ulong uVar1;
  int *piVar2;
  int local_18;
  int local_14;
  int i;
  int lastN;
  Chat *this_local;
  
  this->promptLines_ = 1;
  local_18 = 0;
  while( true ) {
    uVar1 = std::__cxx11::wstring::size();
    if (uVar1 <= (ulong)(long)local_18) break;
    piVar2 = (int *)std::__cxx11::wstring::operator[]((ulong)&this->prompt_);
    if (*piVar2 == 10) {
      this->promptLines_ = this->promptLines_ + 1;
      local_14 = local_18;
    }
    local_18 = local_18 + 1;
  }
  this->promptLastLine_ = local_18 - local_14;
  return;
}

Assistant:

void Chat::calcPrompt()
{
	promptLines_ = 1;
	int lastN, i;
	for (i = 0; i < prompt_.size(); i++)
	{
		if (prompt_[i] == '\n')
		{
			promptLines_++;
			lastN = i;
		}
	}
	promptLastLine_ = i - lastN;
}